

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-metadce.cpp
# Opt level: O1

void __thiscall MetaDCEGraph::MetaDCEGraph(MetaDCEGraph *this,Module *wasm)

{
  long *plVar1;
  long lVar2;
  undefined4 local_168 [2];
  undefined1 *local_160 [2];
  undefined1 local_150 [16];
  undefined4 local_140;
  undefined1 *local_138 [2];
  undefined1 local_128 [16];
  undefined4 local_118;
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined4 local_f0;
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined4 local_c8;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined4 local_a0;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined4 local_78;
  long *local_70 [2];
  long local_60 [2];
  undefined1 local_50 [21];
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39 [9];
  
  (this->nodes)._M_h._M_buckets = &(this->nodes)._M_h._M_single_bucket;
  (this->nodes)._M_h._M_bucket_count = 1;
  (this->nodes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->nodes)._M_h._M_element_count = 0;
  (this->nodes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->nodes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->nodes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->roots)._M_h._M_buckets = &(this->roots)._M_h._M_single_bucket;
  (this->roots)._M_h._M_bucket_count = 1;
  (this->roots)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->roots)._M_h._M_element_count = 0;
  (this->roots)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->roots)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->roots)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->exportToDCENode)._M_h._M_buckets = &(this->exportToDCENode)._M_h._M_single_bucket;
  (this->exportToDCENode)._M_h._M_bucket_count = 1;
  (this->exportToDCENode)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->exportToDCENode)._M_h._M_element_count = 0;
  (this->exportToDCENode)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->exportToDCENode)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->exportToDCENode)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->itemToDCENode)._M_h._M_buckets = &(this->itemToDCENode)._M_h._M_single_bucket;
  (this->itemToDCENode)._M_h._M_bucket_count = 1;
  (this->itemToDCENode)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->itemToDCENode)._M_h._M_element_count = 0;
  (this->itemToDCENode)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->itemToDCENode)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->itemToDCENode)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->importIdToDCENode)._M_h._M_buckets = &(this->importIdToDCENode)._M_h._M_single_bucket;
  (this->importIdToDCENode)._M_h._M_bucket_count = 1;
  (this->importIdToDCENode)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->importIdToDCENode)._M_h._M_element_count = 0;
  (this->importIdToDCENode)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->importIdToDCENode)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->importIdToDCENode)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->wasm = wasm;
  local_168[0] = 0;
  local_160[0] = local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"func","");
  local_140 = 1;
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"table","");
  local_118 = 2;
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"memory","");
  local_f0 = 3;
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"global","");
  local_c8 = 4;
  local_c0[0] = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"tag","");
  local_a0 = 5;
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"dseg","");
  local_78 = 6;
  plVar1 = local_60;
  local_70[0] = plVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"eseg","");
  std::
  _Hashtable<wasm::ModuleItemKind,std::pair<wasm::ModuleItemKind_const,std::__cxx11::string>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<wasm::ModuleItemKind>,std::hash<wasm::ModuleItemKind>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<wasm::ModuleItemKind_const,std::__cxx11::string>const*>
            ((_Hashtable<wasm::ModuleItemKind,std::pair<wasm::ModuleItemKind_const,std::__cxx11::string>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<wasm::ModuleItemKind>,std::hash<wasm::ModuleItemKind>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->kindPrefixes,local_168,local_50,0,&local_3b,&local_3a,local_39);
  lVar2 = -0x118;
  do {
    if (plVar1 != (long *)plVar1[-2]) {
      operator_delete((long *)plVar1[-2],*plVar1 + 1);
    }
    plVar1 = plVar1 + -5;
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0);
  this->nameIndex = 0;
  (this->reached)._M_h._M_buckets = &(this->reached)._M_h._M_single_bucket;
  (this->reached)._M_h._M_bucket_count = 1;
  (this->reached)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->reached)._M_h._M_element_count = 0;
  (this->reached)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->reached)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->reached)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

MetaDCEGraph(Module& wasm) : wasm(wasm) {}